

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test::
~ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test
          (ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this)

{
  ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this_local;
  
  ~ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_compression_of_big_buffer_in_chunks)
{
    std::vector<unsigned char> input_buffer;
    input_buffer.reserve(BIGGER_TEXT.size() * 1024);
    for (int i = 0; i < 1024; i++)
    {
        for (int j = 0; j < BIGGER_TEXT.size(); j++)
        {
            input_buffer.emplace_back(BIGGER_TEXT[j]);
        }
    }

    TestCompression(input_buffer, 65536);
}